

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

void __thiscall duckdb::Binder::SetAlwaysRequireRebind(Binder *this)

{
  Binder *pBVar1;
  
  pBVar1 = GetRootBinder(this);
  (pBVar1->prop).always_require_rebind = true;
  return;
}

Assistant:

void Binder::SetAlwaysRequireRebind() {
	auto &properties = GetStatementProperties();
	properties.always_require_rebind = true;
}